

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void __thiscall
Fixpp::impl::
FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>>>
::
parse<Fixpp::impl::TagSet<Fixpp::ComponentBlock<Fixpp::TagT<600u,Fixpp::Type::String>,Fixpp::TagT<601u,Fixpp::Type::String>,Fixpp::TagT<602u,Fixpp::Type::String>,Fixpp::TagT<603u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<604u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>,Fixpp::TagT<607u,Fixpp::Type::Int>,Fixpp::TagT<608u,Fixpp::Type::String>,Fixpp::TagT<609u,Fixpp::Type::String>,Fixpp::TagT<764u,Fixpp::Type::String>,Fixpp::TagT<610u,Fixpp::Type::String>,Fixpp::TagT<611u,Fixpp::Type::String>,Fixpp::TagT<248u,Fixpp::Type::String>,Fixpp::TagT<249u,Fixpp::Type::String>,Fixpp::TagT<250u,Fixpp::Type::Int>,Fixpp::TagT<251u,Fixpp::Type::Int>,Fixpp::TagT<252u,Fixpp::Type::Float>,Fixpp::TagT<253u,Fixpp::Type::Float>,Fixpp::TagT<257u,Fixpp::Type::String>,Fixpp::TagT<599u,Fixpp::Type::String>,Fixpp::TagT<596u,Fixpp::Type::String>,Fixpp::TagT<597u,Fixpp::Type::String>,Fixpp::TagT<598u,Fixpp::Type::String>,Fixpp::TagT<254u,Fixpp::Type::String>,Fixpp::TagT<612u,Fixpp::Type::Float>,Fixpp::TagT<942u,Fixpp::Type::String>,Fixpp::TagT<613u,Fixpp::Type::Char>,Fixpp::TagT<614u,Fixpp::Type::Float>,Fixpp::TagT<615u,Fixpp::Type::Float>,Fixpp::TagT<616u,Fixpp::Type::String>,Fixpp::TagT<617u,Fixpp::Type::String>,Fixpp::TagT<618u,Fixpp::Type::Int>,Fixpp::TagT<619u,Fixpp::Type::Data>,Fixpp::TagT<620u,Fixpp::Type::String>,Fixpp::TagT<621u,Fixpp::Type::Int>,Fixpp::TagT<622u,Fixpp::Type::Data>,Fixpp::TagT<623u,Fixpp::Type::Float>,Fixpp::TagT<624u,Fixpp::Type::Char>,Fixpp::TagT<556u,Fixpp::Type::String>,Fixpp::TagT<740u,Fixpp::Type::String>,Fixpp::TagT<739u,Fixpp::Type::String>,Fixpp::TagT<955u,Fixpp::Type::String>,Fixpp::TagT<956u,Fixpp::Type::String>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>>>
           *this,Field *field,ParsingContext *context,
          TagSet<Fixpp::ComponentBlock<Fixpp::TagT<600U,_Fixpp::Type::String>,_Fixpp::TagT<601U,_Fixpp::Type::String>,_Fixpp::TagT<602U,_Fixpp::Type::String>,_Fixpp::TagT<603U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>,_Fixpp::TagT<607U,_Fixpp::Type::Int>,_Fixpp::TagT<608U,_Fixpp::Type::String>,_Fixpp::TagT<609U,_Fixpp::Type::String>,_Fixpp::TagT<764U,_Fixpp::Type::String>,_Fixpp::TagT<610U,_Fixpp::Type::String>,_Fixpp::TagT<611U,_Fixpp::Type::String>,_Fixpp::TagT<248U,_Fixpp::Type::String>,_Fixpp::TagT<249U,_Fixpp::Type::String>,_Fixpp::TagT<250U,_Fixpp::Type::Int>,_Fixpp::TagT<251U,_Fixpp::Type::Int>,_Fixpp::TagT<252U,_Fixpp::Type::Float>,_Fixpp::TagT<253U,_Fixpp::Type::Float>,_Fixpp::TagT<257U,_Fixpp::Type::String>,_Fixpp::TagT<599U,_Fixpp::Type::String>,_Fixpp::TagT<596U,_Fixpp::Type::String>,_Fixpp::TagT<597U,_Fixpp::Type::String>,_Fixpp::TagT<598U,_Fixpp::Type::String>,_Fixpp::TagT<254U,_Fixpp::Type::String>,_Fixpp::TagT<612U,_Fixpp::Type::Float>,_Fixpp::TagT<942U,_Fixpp::Type::String>,_Fixpp::TagT<613U,_Fixpp::Type::Char>,_Fixpp::TagT<614U,_Fixpp::Type::Float>,_Fixpp::TagT<615U,_Fixpp::Type::Float>,_Fixpp::TagT<616U,_Fixpp::Type::String>,_Fixpp::TagT<617U,_Fixpp::Type::String>,_Fixpp::TagT<618U,_Fixpp::Type::Int>,_Fixpp::TagT<619U,_Fixpp::Type::Data>,_Fixpp::TagT<620U,_Fixpp::Type::String>,_Fixpp::TagT<621U,_Fixpp::Type::Int>,_Fixpp::TagT<622U,_Fixpp::Type::Data>,_Fixpp::TagT<623U,_Fixpp::Type::Float>,_Fixpp::TagT<624U,_Fixpp::Type::Char>,_Fixpp::TagT<556U,_Fixpp::Type::String>,_Fixpp::TagT<740U,_Fixpp::Type::String>,_Fixpp::TagT<739U,_Fixpp::Type::String>,_Fixpp::TagT<955U,_Fixpp::Type::String>,_Fixpp::TagT<956U,_Fixpp::Type::String>_>_>
          *tagSet,bool strict,bool skipUnknown)

{
  StreamCursor *this_00;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  size_t sVar7;
  long lVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  Type type;
  size_t sVar14;
  size_t sVar15;
  size_t count;
  StreamBuf<char> *pSVar16;
  ulong uVar17;
  uint tag;
  int iVar18;
  undefined1 auStack_208 [8];
  GroupType groupRef;
  undefined1 auStack_c8 [8];
  GroupSet groupSet;
  Visitor visitor;
  long lVar8;
  
  this_00 = context->cursor;
  pSVar16 = this_00->buf;
  lVar6 = *(long *)&pSVar16->field_0x10;
  lVar8 = *(long *)&pSVar16->field_0x18;
  if (lVar8 == lVar6) {
    lVar6 = (**(code **)(*(long *)pSVar16 + 0x38))();
    pSVar16 = this_00->buf;
    if (lVar6 != 0) {
      lVar6 = *(long *)&pSVar16->field_0x10;
      lVar8 = *(long *)&pSVar16->field_0x18;
      goto LAB_009bdd9b;
    }
  }
  else {
LAB_009bdd9b:
    sVar7 = lVar8 - lVar6;
    if (sVar7 == 0) {
      sVar7 = (**(code **)(*(long *)pSVar16 + 0x38))();
    }
    sVar14 = 0;
    iVar18 = 0;
    do {
      sVar15 = sVar14;
      if (9 < (byte)(*(byte *)(lVar6 + sVar14) - 0x30)) break;
      iVar18 = (uint)*(byte *)(lVar6 + sVar14) + iVar18 * 10 + -0x30;
      sVar14 = sVar14 + 1;
      sVar15 = sVar7;
    } while (sVar7 != sVar14);
    if (sVar15 != 0) {
      StreamCursor::advance(this_00,sVar15);
      bVar2 = StreamCursor::advance(this_00,1);
      if (iVar18 == 0) {
        if (!bVar2) {
          pcVar13 = "Got early EOF after tag %d value";
          goto LAB_009be34a;
        }
      }
      else {
        if (!bVar2) {
          pcVar13 = "Expected RepeatingGroup %d, got EOF";
LAB_009be34a:
          ParsingContext::setError(context,Incomplete,pcVar13,0x25c);
          return;
        }
        if ((ulong)(((long)(field->values).
                           super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>_>
                           .
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>,_false>
                           .
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>,_void>
                           .super_SmallVectorBase.CapacityX -
                     (long)(field->values).
                           super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>_>
                           .
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>,_false>
                           .
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>,_void>
                           .super_SmallVectorBase.BeginX >> 3) * 0x6f96f96f96f96f97) <
            (ulong)(long)iVar18) {
          llvm::
          SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>,_false>
          ::grow((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>,_false>
                  *)field,(long)iVar18);
        }
        groupSet.bits.super__Base_bitset<10UL>._M_w[7] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[8] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[5] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[6] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[3] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[4] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[1] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[2] = 0;
        auStack_c8 = (undefined1  [8])0x0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[0] = 0;
        do {
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
          .values.base.
          super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<605U,_Fixpp::Type::String>_>,_false>.
          value.m_view.second = 0;
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
          .values.base.
          super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<606U,_Fixpp::Type::String>_>,_false>.
          value.m_view.first = (char *)0x0;
          auStack_208 = (undefined1  [8])0x0;
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
          .values.base.
          super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<605U,_Fixpp::Type::String>_>,_false>.
          value.m_view.first = (char *)0x0;
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
          ._32_8_ = 0;
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
          .allBits.super__Base_bitset<1UL>._M_w =
               (_Base_bitset<1UL>)
               ((long)&groupRef.
                       super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                       .unparsed.
                       super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
                       .
                       super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
                       .super_SmallVectorBase + 0x10);
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
          .unparsed.
          super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
          .
          super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
          .
          super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
          .super_SmallVectorBase.EndX =
               (void *)((long)groupRef.
                              super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                              .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.
                              buffer + 0x10);
          bVar2 = true;
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
          .unparsed.
          super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
          .
          super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
          .
          super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
          .super_SmallVectorBase.BeginX =
               (void *)groupRef.
                       super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                       .allBits.super__Base_bitset<1UL>._M_w;
          do {
            while( true ) {
              pSVar16 = this_00->buf;
              uVar1 = *(undefined8 *)&pSVar16->field_0x8;
              lVar6 = *(long *)&pSVar16->field_0x10;
              lVar8 = *(long *)&pSVar16->field_0x18;
              lVar9 = lVar8;
              lVar12 = lVar6;
              bVar3 = bVar2;
              if (lVar8 != lVar6) break;
              lVar9 = (**(code **)(*(long *)pSVar16 + 0x38))();
              pSVar16 = this_00->buf;
              if (lVar9 != 0) {
                lVar9 = *(long *)&pSVar16->field_0x18;
                lVar12 = *(long *)&pSVar16->field_0x10;
                break;
              }
LAB_009be01e:
              pcVar13 = *(char **)&pSVar16->field_0x10;
              pcVar10 = *(char **)&pSVar16->field_0x18;
              if (pcVar10 == pcVar13) {
                lVar9 = (**(code **)(*(long *)pSVar16 + 0x38))();
                if (lVar9 != 0) {
                  pSVar16 = this_00->buf;
                  pcVar13 = *(char **)&pSVar16->field_0x10;
                  pcVar10 = *(char **)&pSVar16->field_0x18;
                  goto LAB_009be045;
                }
                cVar4 = '?';
              }
              else {
LAB_009be045:
                if (pcVar13 < pcVar10) {
                  cVar4 = *pcVar13;
                }
                else {
                  cVar4 = (**(code **)(*(long *)pSVar16 + 0x48))();
                }
              }
              iVar18 = 1;
              ParsingContext::setError
                        (context,ParsingError,
                         "Could not parse tag in RepeatingGroup %d, expected int, got \'%c\'",0x25c,
                         (ulong)(uint)(int)cVar4);
LAB_009be097:
              bVar2 = bVar3;
              pSVar16 = this_00->buf;
              *(undefined8 *)&pSVar16->field_0x8 = uVar1;
              *(long *)&pSVar16->field_0x10 = lVar6;
              *(long *)&pSVar16->field_0x18 = lVar8;
LAB_009be0ad:
              if (iVar18 != 0) {
                if (iVar18 == 10) {
                  llvm::
                  SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>,_false>
                  ::push_back((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>,_false>
                               *)field,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>
                                        *)auStack_208);
                  groupSet.bits.super__Base_bitset<10UL>._M_w[7] = 0;
                  groupSet.bits.super__Base_bitset<10UL>._M_w[8] = 0;
                  groupSet.bits.super__Base_bitset<10UL>._M_w[5] = 0;
                  groupSet.bits.super__Base_bitset<10UL>._M_w[6] = 0;
                  groupSet.bits.super__Base_bitset<10UL>._M_w[3] = 0;
                  groupSet.bits.super__Base_bitset<10UL>._M_w[4] = 0;
                  groupSet.bits.super__Base_bitset<10UL>._M_w[1] = 0;
                  groupSet.bits.super__Base_bitset<10UL>._M_w[2] = 0;
                  auStack_c8 = (undefined1  [8])0x0;
                  groupSet.bits.super__Base_bitset<10UL>._M_w[0] = 0;
                }
                else {
                  bVar2 = (bool)(iVar18 == 0 & bVar2);
                }
                goto LAB_009be28d;
              }
            }
            sVar7 = lVar9 - lVar12;
            if (sVar7 == 0) {
              sVar7 = (**(code **)(*(long *)pSVar16 + 0x38))();
            }
            sVar14 = 0;
            sVar15 = 0;
            do {
              count = sVar14;
              if (9 < (byte)(*(byte *)(lVar12 + sVar14) - 0x30)) break;
              sVar15 = (size_t)(((uint)*(byte *)(lVar12 + sVar14) + (int)sVar15 * 10) - 0x30);
              sVar14 = sVar14 + 1;
              count = sVar7;
            } while (sVar7 != sVar14);
            if (count == 0) {
              pSVar16 = this_00->buf;
              goto LAB_009be01e;
            }
            StreamCursor::advance(this_00,count);
            lVar9 = 1;
            lVar12 = 0;
            do {
              lVar11 = (lVar12 + lVar9) / 2;
              tag = (uint)sVar15;
              if (details::
                  IndexesImpl<meta::pack::Pack<Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>
                  ::Sorted.arr[lVar11] == tag) {
                bVar5 = std::bitset<607UL>::test((bitset<607UL> *)auStack_c8,sVar15);
                iVar18 = 10;
                if (bVar5) goto LAB_009be097;
                bVar3 = StreamCursor::advance(this_00,1);
                if (!bVar3) {
                  pcVar13 = "Expected value after Tag %d, got EOF";
                  goto LAB_009be257;
                }
                TagSet<Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                ::set((TagSet<Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                       *)auStack_c8,tag);
                groupSet.bits.super__Base_bitset<10UL>._M_w[9]._0_1_ = '\0';
                doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>>>::Visitor,0ul,1ul>
                          (auStack_208,sVar15,groupSet.bits.super__Base_bitset<10UL>._M_w + 9);
                iVar18 = 0;
                if (((char)groupSet.bits.super__Base_bitset<10UL>._M_w[9] == '\0') &&
                   (bVar3 = StreamCursor::advance(this_00,1), !bVar3)) {
                  iVar18 = 1;
                  ParsingContext::setError
                            (context,Incomplete,"Got early EOF in RepeatingGroup %d",0x25c);
                }
                goto LAB_009be0ad;
              }
              if (details::
                  IndexesImpl<meta::pack::Pack<Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>
                  ::Sorted.arr[lVar11] < (int)tag) {
                lVar12 = lVar11 + 1;
              }
              else {
                lVar9 = lVar11 + -1;
              }
            } while (lVar12 <= lVar9);
            lVar9 = 0x29;
            lVar12 = 0;
            do {
              lVar11 = (lVar12 + lVar9) / 2;
              if (details::
                  IndexesImpl<meta::pack::Pack<Fixpp::TagT<600U,_Fixpp::Type::String>,_Fixpp::TagT<601U,_Fixpp::Type::String>,_Fixpp::TagT<602U,_Fixpp::Type::String>,_Fixpp::TagT<603U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>,_Fixpp::TagT<607U,_Fixpp::Type::Int>,_Fixpp::TagT<608U,_Fixpp::Type::String>,_Fixpp::TagT<609U,_Fixpp::Type::String>,_Fixpp::TagT<764U,_Fixpp::Type::String>,_Fixpp::TagT<610U,_Fixpp::Type::String>,_Fixpp::TagT<611U,_Fixpp::Type::String>,_Fixpp::TagT<248U,_Fixpp::Type::String>,_Fixpp::TagT<249U,_Fixpp::Type::String>,_Fixpp::TagT<250U,_Fixpp::Type::Int>,_Fixpp::TagT<251U,_Fixpp::Type::Int>,_Fixpp::TagT<252U,_Fixpp::Type::Float>,_Fixpp::TagT<253U,_Fixpp::Type::Float>,_Fixpp::TagT<257U,_Fixpp::Type::String>,_Fixpp::TagT<599U,_Fixpp::Type::String>,_Fixpp::TagT<596U,_Fixpp::Type::String>,_Fixpp::TagT<597U,_Fixpp::Type::String>,_Fixpp::TagT<598U,_Fixpp::Type::String>,_Fixpp::TagT<254U,_Fixpp::Type::String>,_Fixpp::TagT<612U,_Fixpp::Type::Float>,_Fixpp::TagT<942U,_Fixpp::Type::String>,_Fixpp::TagT<613U,_Fixpp::Type::Char>,_Fixpp::TagT<614U,_Fixpp::Type::Float>,_Fixpp::TagT<615U,_Fixpp::Type::Float>,_Fixpp::TagT<616U,_Fixpp::Type::String>,_Fixpp::TagT<617U,_Fixpp::Type::String>,_Fixpp::TagT<618U,_Fixpp::Type::Int>,_Fixpp::TagT<619U,_Fixpp::Type::Data>,_Fixpp::TagT<620U,_Fixpp::Type::String>,_Fixpp::TagT<621U,_Fixpp::Type::Int>,_Fixpp::TagT<622U,_Fixpp::Type::Data>,_Fixpp::TagT<623U,_Fixpp::Type::Float>,_Fixpp::TagT<624U,_Fixpp::Type::Char>,_Fixpp::TagT<556U,_Fixpp::Type::String>,_Fixpp::TagT<740U,_Fixpp::Type::String>,_Fixpp::TagT<739U,_Fixpp::Type::String>,_Fixpp::TagT<955U,_Fixpp::Type::String>,_Fixpp::TagT<956U,_Fixpp::Type::String>_>_>
                  ::Sorted.arr[lVar11] == tag) goto LAB_009bdf8f;
              if (details::
                  IndexesImpl<meta::pack::Pack<Fixpp::TagT<600U,_Fixpp::Type::String>,_Fixpp::TagT<601U,_Fixpp::Type::String>,_Fixpp::TagT<602U,_Fixpp::Type::String>,_Fixpp::TagT<603U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>,_Fixpp::TagT<607U,_Fixpp::Type::Int>,_Fixpp::TagT<608U,_Fixpp::Type::String>,_Fixpp::TagT<609U,_Fixpp::Type::String>,_Fixpp::TagT<764U,_Fixpp::Type::String>,_Fixpp::TagT<610U,_Fixpp::Type::String>,_Fixpp::TagT<611U,_Fixpp::Type::String>,_Fixpp::TagT<248U,_Fixpp::Type::String>,_Fixpp::TagT<249U,_Fixpp::Type::String>,_Fixpp::TagT<250U,_Fixpp::Type::Int>,_Fixpp::TagT<251U,_Fixpp::Type::Int>,_Fixpp::TagT<252U,_Fixpp::Type::Float>,_Fixpp::TagT<253U,_Fixpp::Type::Float>,_Fixpp::TagT<257U,_Fixpp::Type::String>,_Fixpp::TagT<599U,_Fixpp::Type::String>,_Fixpp::TagT<596U,_Fixpp::Type::String>,_Fixpp::TagT<597U,_Fixpp::Type::String>,_Fixpp::TagT<598U,_Fixpp::Type::String>,_Fixpp::TagT<254U,_Fixpp::Type::String>,_Fixpp::TagT<612U,_Fixpp::Type::Float>,_Fixpp::TagT<942U,_Fixpp::Type::String>,_Fixpp::TagT<613U,_Fixpp::Type::Char>,_Fixpp::TagT<614U,_Fixpp::Type::Float>,_Fixpp::TagT<615U,_Fixpp::Type::Float>,_Fixpp::TagT<616U,_Fixpp::Type::String>,_Fixpp::TagT<617U,_Fixpp::Type::String>,_Fixpp::TagT<618U,_Fixpp::Type::Int>,_Fixpp::TagT<619U,_Fixpp::Type::Data>,_Fixpp::TagT<620U,_Fixpp::Type::String>,_Fixpp::TagT<621U,_Fixpp::Type::Int>,_Fixpp::TagT<622U,_Fixpp::Type::Data>,_Fixpp::TagT<623U,_Fixpp::Type::Float>,_Fixpp::TagT<624U,_Fixpp::Type::Char>,_Fixpp::TagT<556U,_Fixpp::Type::String>,_Fixpp::TagT<740U,_Fixpp::Type::String>,_Fixpp::TagT<739U,_Fixpp::Type::String>,_Fixpp::TagT<955U,_Fixpp::Type::String>,_Fixpp::TagT<956U,_Fixpp::Type::String>_>_>
                  ::Sorted.arr[lVar11] < (int)tag) {
                lVar12 = lVar11 + 1;
              }
              else {
                lVar9 = lVar11 + -1;
              }
            } while (lVar12 <= lVar9);
            lVar11 = -1;
LAB_009bdf8f:
            iVar18 = 10;
            bVar3 = false;
            if ((lVar11 != -1) || (bVar3 = false, tag == 10)) goto LAB_009be097;
            bVar3 = StreamCursor::advance(this_00,1);
            if (!bVar3) {
              pcVar13 = "Expected value after tag %d, got EOF";
LAB_009be257:
              bVar2 = false;
              ParsingContext::setError(context,Incomplete,pcVar13,sVar15);
              goto LAB_009be28d;
            }
            lVar6 = *(long *)&this_00->buf->field_0x8;
            lVar8 = *(long *)&this_00->buf->field_0x10;
            while( true ) {
              pSVar16 = this_00->buf;
              pcVar13 = *(char **)&pSVar16->field_0x10;
              pcVar10 = *(char **)&pSVar16->field_0x18;
              if (pcVar10 == pcVar13) {
                lVar9 = (**(code **)(*(long *)pSVar16 + 0x38))();
                if (lVar9 == 0) {
                  type = ParsingError;
                  pcVar13 = "Expected value after tag %d, got EOF";
                  goto LAB_009be228;
                }
                pSVar16 = this_00->buf;
                pcVar13 = *(char **)&pSVar16->field_0x10;
                pcVar10 = *(char **)&pSVar16->field_0x18;
              }
              if (pcVar13 < pcVar10) {
                cVar4 = *pcVar13;
              }
              else {
                cVar4 = (**(code **)(*(long *)pSVar16 + 0x48))();
              }
              if (cVar4 == '|') break;
              StreamCursor::advance(this_00,1);
            }
            if (strict) {
              bVar2 = false;
              ParsingContext::setError
                        (context,UnknownTag,"Encountered unknown tag %d in RepeatingGroup %d",sVar15
                         ,0x25c);
              goto LAB_009be28d;
            }
            if (!skipUnknown) {
              lVar9 = *(long *)&this_00->buf->field_0x10;
              lVar12 = *(long *)&this_00->buf->field_0x8;
              if (groupRef.
                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                  .unparsed.
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
                  .
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
                  .
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
                  .super_SmallVectorBase.EndX <=
                  groupRef.
                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                  .unparsed.
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
                  .
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
                  .
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
                  .super_SmallVectorBase.BeginX) {
                llvm::
                SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
                ::grow((SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
                        *)&groupRef.
                           super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                           .allBits,0);
              }
              *(uint *)groupRef.
                       super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                       .unparsed.
                       super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
                       .
                       super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
                       .super_SmallVectorBase.BeginX = tag;
              *(long *)((long)groupRef.
                              super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                              .unparsed.
                              super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
                              .
                              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
                              .
                              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
                              .super_SmallVectorBase.BeginX + 8) = lVar8;
              *(long *)((long)groupRef.
                              super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                              .unparsed.
                              super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
                              .
                              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
                              .
                              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
                              .super_SmallVectorBase.BeginX + 0x10) =
                   (lVar6 + lVar9) - (lVar12 + lVar8);
              groupRef.
              super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
              .unparsed.
              super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
              .
              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
              .
              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
              .super_SmallVectorBase.BeginX =
                   (void *)((long)groupRef.
                                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                                  .unparsed.
                                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
                                  .
                                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
                                  .
                                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
                                  .super_SmallVectorBase.BeginX + 0x18);
            }
            bVar3 = StreamCursor::advance(this_00,1);
          } while (bVar3);
          type = Incomplete;
          pcVar13 = "Got early EOF after tag %d value";
LAB_009be228:
          bVar2 = false;
          ParsingContext::setError(context,type,pcVar13,sVar15);
LAB_009be28d:
          if (groupRef.
              super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
              .allBits.super__Base_bitset<1UL>._M_w !=
              (_Base_bitset<1UL>)
              ((long)&groupRef.
                      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                      .unparsed.
                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
                      .
                      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
                      .
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
                      .super_SmallVectorBase + 0x10U)) {
            free((void *)groupRef.
                         super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                         .allBits.super__Base_bitset<1UL>._M_w);
          }
        } while (bVar2);
      }
      return;
    }
    pSVar16 = this_00->buf;
  }
  pcVar13 = *(char **)&pSVar16->field_0x10;
  pcVar10 = *(char **)&pSVar16->field_0x18;
  if (pcVar10 == pcVar13) {
    lVar6 = (**(code **)(*(long *)pSVar16 + 0x38))();
    if (lVar6 == 0) {
      uVar17 = 0x3f;
      goto LAB_009be2f7;
    }
    pSVar16 = this_00->buf;
    pcVar13 = *(char **)&pSVar16->field_0x10;
    pcVar10 = *(char **)&pSVar16->field_0x18;
  }
  if (pcVar13 < pcVar10) {
    cVar4 = *pcVar13;
  }
  else {
    cVar4 = (**(code **)(*(long *)pSVar16 + 0x48))();
  }
  uVar17 = (ulong)(uint)(int)cVar4;
LAB_009be2f7:
  ParsingContext::setError
            (context,ParsingError,
             "Could not parse instances number in RepeatingGroup %d, expected int, got \'%c\'",0x25c
             ,uVar17);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool strict, bool skipUnknown)
            {
                auto& cursor = context.cursor;

                int instances;
                TRY_MATCH_INT(
                    instances,
                    "Could not parse instances number in RepeatingGroup %d, expected int, got '%c'",
                     GroupTag::Id, CURSOR_CURRENT(cursor)
                );

                if (!instances)
                {
                    TRY_ADVANCE("Got early EOF after tag %d value", GroupTag::Id);
                    return;
                }

                // Literal('=')
                TRY_ADVANCE("Expected RepeatingGroup %d, got EOF", GroupTag::Id);

                field.reserve(instances);

                GroupSet groupSet;

                int tag;
                bool inGroup = true;

                do
                {
                    typename Field::GroupType groupRef;

                    for (;;)
                    {

                        StreamCursor::Revert revertTag(cursor);
                        TRY_MATCH_INT(
                            tag,
                            "Could not parse tag in RepeatingGroup %d, expected int, got '%c'",
                            GroupTag::Id, CURSOR_CURRENT(cursor)
                        );

                        // The tag we just encountered is invalid for the RepeatingGroup
                        if (!groupSet.valid(tag))
                        {
                            // If it's not valid for the Message either, we consider it to be
                            // a custom tag
                            if (!tagSet.valid(tag) && tag != 10)
                            {
                                revertTag.ignore();
                                TRY_ADVANCE("Expected value after tag %d, got EOF", tag);

                                StreamCursor::Token valueToken(cursor);
                                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                                if (!strict)
                                {
                                    if (!skipUnknown)
                                        groupRef.unparsed.emplace_back(tag, valueToken.view());
                                    TRY_ADVANCE("Got early EOF after tag %d value", tag);
                                    continue;
                                }
                                else if (strict)
                                {
                                    context.setError(ErrorKind::UnknownTag, "Encountered unknown tag %d in RepeatingGroup %d", tag, GroupTag::Id);
                                    return;
                                }
                            }

                            inGroup = false;
                            break;
                        }

                        // The tag is already set in our GroupSet, we finished parsing the current instance
                        if (groupSet.test(tag))
                            break;

                        revertTag.ignore();

                        // Literal('=')
                        TRY_ADVANCE("Expected value after Tag %d, got EOF", tag);

                        groupSet.set(tag);

                        Visitor visitor(context, groupSet, strict, skipUnknown);

                        // Invariant: here visitField should ALWAYS return true as we are checking if the tag
                        // is valid prior to the call
                        //
                        // TODO: enfore the invariant ?
                        visitField(groupRef, tag, visitor);

                        // If we are in a recursive RepeatingGroup parsing, we must *NOT* advance the cursor
                        if (!visitor.recursive)
                            TRY_ADVANCE("Got early EOF in RepeatingGroup %d", GroupTag::Id);
                    }

                    field.add(std::move(groupRef));
                    groupSet.reset();

                } while (inGroup);

            }